

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexes.c
# Opt level: O3

void add_radial_scalar(FmsDataCollection dc,FmsComponent volume,char *name,int order,int *dims,
                      double *verts,int nverts,int *edges,int nedges,int *faces,int nfaces,
                      int ncells)

{
  double dVar1;
  uint uVar2;
  void *__ptr;
  long lVar3;
  double *pdVar4;
  void *data;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  FmsFieldDescriptor fd;
  FmsMetaData mdata;
  FmsField f;
  char fdname [100];
  FmsFieldDescriptor local_b0;
  FmsMetaData local_a8;
  FmsField local_a0;
  char local_98 [104];
  
  sprintf(local_98,"%s descriptor");
  FmsDataCollectionAddFieldDescriptor(dc,local_98,&local_b0);
  FmsFieldDescriptorSetComponent(local_b0,volume);
  FmsFieldDescriptorSetFixedOrder(local_b0,FMS_CONTINUOUS,FMS_NODAL_GAUSS_CLOSED,(long)order);
  iVar8 = order + -1;
  uVar2 = ((ncells * iVar8 + nfaces) * iVar8 + nedges) * iVar8 + nverts;
  lVar10 = (long)(int)uVar2;
  __ptr = malloc(lVar10 * 0x18);
  uVar9 = (ulong)(uint)nverts;
  if (0 < nverts) {
    uVar5 = 0;
    pdVar7 = verts;
    do {
      *(double *)((long)__ptr + uVar5 * 8) = *pdVar7;
      uVar5 = uVar5 + 1;
      pdVar7 = pdVar7 + 3;
    } while (uVar9 != uVar5);
  }
  pdVar7 = (double *)((long)__ptr + lVar10 * 8);
  lVar3 = (long)nverts;
  pdVar4 = append_coord_dofs_edge
                     (order,(double *)((long)__ptr + lVar3 * 8),verts,edges,nedges,0.0,0);
  pdVar4 = append_coord_dofs_face(order,pdVar4,verts,edges,faces,nfaces,0.0,0);
  append_coord_dofs_cell(order,pdVar4,dims,verts,0.0,0);
  if (nverts < 1) {
    pdVar4 = append_coord_dofs_edge(order,pdVar7 + lVar3,verts,edges,nedges,0.0,1);
    pdVar4 = append_coord_dofs_face(order,pdVar4,verts,edges,faces,nfaces,0.0,1);
    append_coord_dofs_cell(order,pdVar4,dims,verts,0.0,1);
  }
  else {
    lVar6 = 0;
    pdVar4 = pdVar7;
    do {
      *pdVar4 = verts[lVar6 + 1];
      lVar6 = lVar6 + 3;
      pdVar4 = pdVar4 + 1;
    } while (uVar9 * 3 != lVar6);
    pdVar4 = append_coord_dofs_edge(order,pdVar7 + lVar3,verts,edges,nedges,0.0,1);
    pdVar4 = append_coord_dofs_face(order,pdVar4,verts,edges,faces,nfaces,0.0,1);
    append_coord_dofs_cell(order,pdVar4,dims,verts,0.0,1);
    pdVar4 = verts + 2;
    uVar5 = 0;
    do {
      *(double *)((long)__ptr + uVar5 * 8 + (long)(int)(uVar2 * 2) * 8) = *pdVar4;
      uVar5 = uVar5 + 1;
      pdVar4 = pdVar4 + 3;
    } while (uVar9 != uVar5);
  }
  pdVar4 = append_coord_dofs_edge
                     (order,(double *)((long)__ptr + lVar3 * 8 + (long)(int)(uVar2 * 2) * 8),verts,
                      edges,nedges,0.0,2);
  pdVar4 = append_coord_dofs_face(order,pdVar4,verts,edges,faces,nfaces,0.0,2);
  append_coord_dofs_cell(order,pdVar4,dims,verts,0.0,2);
  data = malloc(lVar10 * 8);
  if (0 < (int)uVar2) {
    lVar10 = 0;
    do {
      dVar1 = *(double *)((long)__ptr + lVar10 + (long)(int)(uVar2 * 2) * 8);
      *(double *)((long)data + lVar10) =
           SQRT(dVar1 * dVar1 +
                *(double *)((long)__ptr + lVar10) * *(double *)((long)__ptr + lVar10) +
                *(double *)((long)pdVar7 + lVar10) * *(double *)((long)pdVar7 + lVar10));
      lVar10 = lVar10 + 8;
    } while ((ulong)uVar2 << 3 != lVar10);
  }
  FmsDataCollectionAddField(dc,name,&local_a0);
  FmsFieldSet(local_a0,local_b0,1,FMS_BY_VDIM,FMS_DOUBLE,data);
  FmsFieldAttachMetaData(local_a0,&local_a8);
  FmsMetaDataSetString(local_a8,"units","cm");
  free(data);
  free(__ptr);
  return;
}

Assistant:

void
add_radial_scalar(FmsDataCollection dc, FmsComponent volume,
                  const char *name, int order, const int *dims,
                  const double *verts, int nverts,
                  const int *edges, int nedges,
                  const int *faces, int nfaces,
                  int ncells) {
  int i, ndofs;
  double *data, *coords, *x, *y, *z;
  char fdname[100];

  /* Create a field descriptor for the coordinates that live on "surface". */
  sprintf(fdname, "%s descriptor", name);
  FmsFieldDescriptor fd;
  FmsDataCollectionAddFieldDescriptor(dc, fdname, &fd);
  FmsFieldDescriptorSetComponent(fd, volume);
  FmsFieldDescriptorSetFixedOrder(fd, FMS_CONTINUOUS,
                                  FMS_NODAL_GAUSS_CLOSED, order);

  /* First, make coordinates of the target order. */
  ndofs = dofs_for_order(order, nverts, nedges, nfaces, ncells);

  /* Make the coordinate data. Make it BYNODE xxxx...yyyy...zzzz... */
  coords = (double *)malloc(ndofs * sizeof(double)*3);
  x = coords;
  y = coords + ndofs;
  z = coords + 2*ndofs;

  /* Store coordinate dofs by node. */
  x = append_coord_dofs_verts(x, verts, nverts, 0);
  x = append_coord_dofs_edge(order, x, verts, edges, nedges, 0., 0);
  x = append_coord_dofs_face(order, x, verts, edges, faces, nfaces, 0., 0);
  x = append_coord_dofs_cell(order, x, dims, verts, 0., 0);

  y = append_coord_dofs_verts(y, verts, nverts, 1);
  y = append_coord_dofs_edge(order, y, verts, edges, nedges, 0., 1);
  y = append_coord_dofs_face(order, y, verts, edges, faces, nfaces, 0., 1);
  y = append_coord_dofs_cell(order, y, dims, verts, 0., 1);

  z = append_coord_dofs_verts(z, verts, nverts, 2);
  z = append_coord_dofs_edge(order, z, verts, edges, nedges, 0., 2);
  z = append_coord_dofs_face(order, z, verts, edges, faces, nfaces, 0., 2);
  z = append_coord_dofs_cell(order, z, dims, verts, 0., 2);

  /* Make the radial data. */
  x = coords;
  y = coords + ndofs;
  z = coords + 2*ndofs;
  data = (double *)malloc(ndofs * sizeof(double));
  for(i = 0; i < ndofs; ++i) {
    data[i] = sqrt(x[i]*x[i] + y[i]*y[i] + z[i]*z[i]);
  }

#if 0
  /* Write coordinate dofs as Point3D so we can plot them. */
  char tmp[100];
  sprintf(tmp, "%s.3D", name);
  FILE *fp = fopen(tmp, "wt");
  fprintf(fp, "X Y Z dof\n");
  for(i = 0; i < ndofs; ++i)
    fprintf(fp, "%lg %lg 0. %f\n", coords[i*2],coords[i*2+1], data[i]);
  fclose(fp);
#endif

  /* Add the coordinates to the data collection. */
  FmsField f;
  FmsDataCollectionAddField(dc, name, &f);
  FmsFieldSet(f, fd, 1, FMS_BY_VDIM, FMS_DOUBLE, data);

  /* Add some field metadata. (optional) */
  FmsMetaData mdata;
  FmsFieldAttachMetaData(f, &mdata);
  FmsMetaDataSetString(mdata, "units", "cm");

  free(data);
  free(coords);
}